

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta)

{
  int *args_1;
  bool bVar1;
  rc_size rVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint r_size;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  float theta_local;
  float delta_local;
  float kappa_local;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  theta_local = theta;
  delta_local = delta;
  kappa_local = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&kappa_local,&delta_local,&theta_local);
  bVar3 = false;
  while( true ) {
    if (first._M_current == last._M_current) {
      return bVar3;
    }
    k = *first._M_current;
    if (*(int *)(this + 0x80) <= k) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)this + 0x10);
    solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
    ::decrease_preference
              ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)this,it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,
               (row_iterator)
               it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
               super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl,
               theta_local);
    rVar2 = solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
            ::compute_reduced_costs<baryonyx::bit_array>
                      ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                        *)this,it.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl,
                       (row_iterator)
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::row_value_*>.
                       super__Head_base<1UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,x);
    r_size = rVar2.r_size;
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
              (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
               *(random_engine **)(this + 8));
    args_1 = (int *)(*(long *)(this + 0x68) + (long)k * 8);
    uVar4 = rVar2.c_size + *args_1;
    if ((int)r_size < (int)uVar4) {
      uVar4 = r_size;
    }
    selected = uVar4 - 1;
    fmt_00._M_str = "constraints {}: {} = ";
    fmt_00._M_len = 0x15;
    debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&k,args_1);
    for (lVar5 = 0; (ulong)(~((int)r_size >> 0x1f) & r_size) * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc
        ) {
      fmt_01._M_str = "{} ({}) ";
      fmt_01._M_len = 8;
      debug_logger<true>::log<float,int>
                ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x60) + lVar5),
                 (int *)(*(long *)(this + 0x60) + 8 + lVar5));
    }
    fmt_02._M_str = " => Selected: {}\n";
    fmt_02._M_len = 0x11;
    debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&selected);
    bVar1 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                      ((solver_equalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                        *)this,x,
                       it.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl,k,selected,r_size,kappa_local,delta_local);
    bVar3 = (bool)(bVar3 | bVar1);
    first._M_current = first._M_current + 1;
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-101.cpp"
                     ,"277");
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }